

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O2

void __thiscall
sf2cute::SoundFont::RemoveSampleIf
          (SoundFont *this,function<bool_(const_std::shared_ptr<sf2cute::SFSample>_&)> *predicate)

{
  __shared_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  bool bVar2;
  long lVar3;
  __normal_iterator<std::shared_ptr<sf2cute::SFSample>_*,_std::vector<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>_>
  __first;
  __normal_iterator<std::shared_ptr<sf2cute::SFSample>_*,_std::vector<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>_>
  _Var4;
  long lVar5;
  function<bool_(const_std::shared_ptr<sf2cute::SFSample>_&)> *local_40;
  function<bool_(const_std::shared_ptr<sf2cute::SFSample>_&)> *local_38;
  
  _Var4._M_current =
       (this->samples_).
       super__Vector_base<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  p_Var1 = &((this->samples_).
             super__Vector_base<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
            super___shared_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>;
  lVar3 = (long)p_Var1 - (long)_Var4._M_current;
  local_40 = predicate;
  local_38 = predicate;
  for (lVar5 = lVar3 >> 6; 0 < lVar5; lVar5 = lVar5 + -1) {
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<sf2cute::SoundFont::RemoveSampleIf(std::function<bool(std::shared_ptr<sf2cute::SFSample>const&)>)::$_0>
            ::operator()((_Iter_pred<sf2cute::SoundFont::RemoveSampleIf(std::function<bool(std::shared_ptr<sf2cute::SFSample>const&)>)::__0>
                          *)&local_40,_Var4);
    __first._M_current = _Var4._M_current;
    if (bVar2) goto LAB_001063f6;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<sf2cute::SoundFont::RemoveSampleIf(std::function<bool(std::shared_ptr<sf2cute::SFSample>const&)>)::$_0>
            ::operator()((_Iter_pred<sf2cute::SoundFont::RemoveSampleIf(std::function<bool(std::shared_ptr<sf2cute::SFSample>const&)>)::__0>
                          *)&local_40,_Var4._M_current + 1);
    __first._M_current = _Var4._M_current + 1;
    if (bVar2) goto LAB_001063f6;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<sf2cute::SoundFont::RemoveSampleIf(std::function<bool(std::shared_ptr<sf2cute::SFSample>const&)>)::$_0>
            ::operator()((_Iter_pred<sf2cute::SoundFont::RemoveSampleIf(std::function<bool(std::shared_ptr<sf2cute::SFSample>const&)>)::__0>
                          *)&local_40,_Var4._M_current + 2);
    __first._M_current = _Var4._M_current + 2;
    if (bVar2) goto LAB_001063f6;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<sf2cute::SoundFont::RemoveSampleIf(std::function<bool(std::shared_ptr<sf2cute::SFSample>const&)>)::$_0>
            ::operator()((_Iter_pred<sf2cute::SoundFont::RemoveSampleIf(std::function<bool(std::shared_ptr<sf2cute::SFSample>const&)>)::__0>
                          *)&local_40,_Var4._M_current + 3);
    __first._M_current = _Var4._M_current + 3;
    if (bVar2) goto LAB_001063f6;
    _Var4._M_current = _Var4._M_current + 4;
    lVar3 = lVar3 + -0x40;
  }
  lVar3 = lVar3 >> 4;
  if (lVar3 == 1) {
LAB_00106472:
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<sf2cute::SoundFont::RemoveSampleIf(std::function<bool(std::shared_ptr<sf2cute::SFSample>const&)>)::$_0>
            ::operator()((_Iter_pred<sf2cute::SoundFont::RemoveSampleIf(std::function<bool(std::shared_ptr<sf2cute::SFSample>const&)>)::__0>
                          *)&local_40,_Var4);
    __first._M_current = _Var4._M_current;
    if (!bVar2) {
      __first._M_current = (shared_ptr<sf2cute::SFSample> *)p_Var1;
    }
  }
  else if (lVar3 == 2) {
LAB_00106456:
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<sf2cute::SoundFont::RemoveSampleIf(std::function<bool(std::shared_ptr<sf2cute::SFSample>const&)>)::$_0>
            ::operator()((_Iter_pred<sf2cute::SoundFont::RemoveSampleIf(std::function<bool(std::shared_ptr<sf2cute::SFSample>const&)>)::__0>
                          *)&local_40,_Var4);
    __first._M_current = _Var4._M_current;
    if (!bVar2) {
      _Var4._M_current = _Var4._M_current + 1;
      goto LAB_00106472;
    }
  }
  else {
    __first._M_current = (shared_ptr<sf2cute::SFSample> *)p_Var1;
    if (lVar3 != 3) goto LAB_00106434;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<sf2cute::SoundFont::RemoveSampleIf(std::function<bool(std::shared_ptr<sf2cute::SFSample>const&)>)::$_0>
            ::operator()((_Iter_pred<sf2cute::SoundFont::RemoveSampleIf(std::function<bool(std::shared_ptr<sf2cute::SFSample>const&)>)::__0>
                          *)&local_40,_Var4);
    __first._M_current = _Var4._M_current;
    if (!bVar2) {
      _Var4._M_current = _Var4._M_current + 1;
      goto LAB_00106456;
    }
  }
LAB_001063f6:
  if (&(__first._M_current)->super___shared_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2> !=
      p_Var1) {
    _Var4._M_current = __first._M_current;
    while (_Var4._M_current =
                (shared_ptr<sf2cute::SFSample> *)
                (&(_Var4._M_current)->
                  super___shared_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2> + 1),
          (__shared_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2> *)_Var4._M_current != p_Var1)
    {
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<sf2cute::SoundFont::RemoveSampleIf(std::function<bool(std::shared_ptr<sf2cute::SFSample>const&)>)::$_0>
              ::operator()((_Iter_pred<sf2cute::SoundFont::RemoveSampleIf(std::function<bool(std::shared_ptr<sf2cute::SFSample>const&)>)::__0>
                            *)&local_38,_Var4);
      if (!bVar2) {
        std::__shared_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&(__first._M_current)->
                    super___shared_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>,
                   (__shared_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2> *)_Var4._M_current);
        __first._M_current =
             (shared_ptr<sf2cute::SFSample> *)
             (&(__first._M_current)->
               super___shared_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2> + 1);
      }
    }
  }
LAB_00106434:
  std::
  vector<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>::
  erase(&this->samples_,(const_iterator)__first._M_current,
        (this->samples_).
        super__Vector_base<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
        ._M_impl.super__Vector_impl_data._M_finish);
  return;
}

Assistant:

void SoundFont::RemoveSampleIf(
    std::function<bool(const std::shared_ptr<SFSample> &)> predicate) {
  samples_.erase(std::remove_if(samples_.begin(), samples_.end(),
    [&predicate](const std::shared_ptr<SFSample> & sample) -> bool {
      if (predicate(sample)) {
        sample->reset_parent_file();
        return true;
      }
      else {
        return false;
      }
    }), samples_.end());
}